

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestApplyResult(void)

{
  float *pfVar1;
  ImGuiContext *pIVar2;
  ImRect rect_abs;
  float scroll_target;
  ImGuiNavItemData *result;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_0000008c;
  ImRect *in_stack_00000090;
  ImGuiWindow *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar3;
  ImGuiWindow *in_stack_ffffffffffffffc0;
  ImGuiWindow *local_38;
  ImGuiWindow *local_10;
  
  pIVar2 = GImGui;
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    if ((GImGui->NavMoveResultOther).ID == 0) {
      in_stack_ffffffffffffffc0 = (ImGuiWindow *)0x0;
      local_38 = in_stack_ffffffffffffffc0;
    }
    else {
      in_stack_ffffffffffffffc0 = (ImGuiWindow *)&GImGui->NavMoveResultOther;
      local_38 = in_stack_ffffffffffffffc0;
    }
  }
  else {
    local_38 = (ImGuiWindow *)&GImGui->NavMoveResultLocal;
  }
  local_10 = local_38;
  if (((GImGui->NavMoveFlags & 0x400U) != 0) &&
     (((GImGui->NavTabbingCounter == 1 || (GImGui->NavTabbingDir == 0)) &&
      ((GImGui->NavTabbingResultFirst).ID != 0)))) {
    local_10 = (ImGuiWindow *)&GImGui->NavTabbingResultFirst;
  }
  if (local_10 == (ImGuiWindow *)0x0) {
    if ((GImGui->NavMoveFlags & 0x400U) != 0) {
      GImGui->NavMoveFlags = GImGui->NavMoveFlags | 0x1000;
    }
    if (pIVar2->NavId == 0) {
      return;
    }
    if ((pIVar2->NavMoveFlags & 0x1000U) != 0) {
      return;
    }
    NavRestoreHighlightAfterMove();
    return;
  }
  if ((((GImGui->NavMoveFlags & 0x20U) != 0) && ((GImGui->NavMoveResultLocalVisible).ID != 0)) &&
     ((GImGui->NavMoveResultLocalVisible).ID != GImGui->NavId)) {
    local_10 = (ImGuiWindow *)&GImGui->NavMoveResultLocalVisible;
  }
  if (((local_10 != (ImGuiWindow *)&GImGui->NavMoveResultOther) &&
      ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    if ((local_10->Size).y <= (GImGui->NavMoveResultOther).DistBox) {
      fVar3 = (GImGui->NavMoveResultOther).DistBox;
      pfVar1 = &(local_10->Size).y;
      if (((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) ||
         ((local_10->SizeFull).x <= (GImGui->NavMoveResultOther).DistCenter)) goto LAB_004ac67b;
    }
    local_10 = (ImGuiWindow *)&GImGui->NavMoveResultOther;
  }
LAB_004ac67b:
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    if ((GImGui->NavMoveFlags & 0x40U) == 0) {
      WindowRectRelToAbs(in_stack_ffffffffffffffc0,
                         (ImRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      ScrollToRectEx(in_stack_00000098,in_stack_00000090,in_stack_0000008c);
    }
    else {
      if (GImGui->NavMoveDir == 2) {
        fVar3 = (((ImGuiWindow *)local_10->Name)->ScrollMax).y;
      }
      else {
        fVar3 = 0.0;
      }
      SetScrollY((ImGuiWindow *)local_10->Name,fVar3);
    }
  }
  if (pIVar2->NavWindow != (ImGuiWindow *)local_10->Name) {
    if ((pIVar2->DebugLogFlags & 2U) != 0) {
      DebugLog("[focus] NavMoveRequest: SetNavWindow(\"%s\")\n",
               ((ImGuiWindow *)local_10->Name)->Name);
    }
    pIVar2->NavWindow = (ImGuiWindow *)local_10->Name;
  }
  if (pIVar2->ActiveId != local_10->ID) {
    ClearActiveID();
  }
  if (pIVar2->NavId != local_10->ID) {
    pIVar2->NavJustMovedToId = local_10->ID;
    pIVar2->NavJustMovedToFocusScopeId = local_10->Flags;
    pIVar2->NavJustMovedToKeyMods = pIVar2->NavMoveKeyMods;
  }
  if ((pIVar2->DebugLogFlags & 8U) != 0) {
    DebugLog("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n",
             (ulong)local_10->ID,(ulong)pIVar2->NavLayer,pIVar2->NavWindow->Name);
  }
  SetNavID(local_10->ID,pIVar2->NavLayer,local_10->Flags,(ImRect *)&local_10->Viewport);
  if (((pIVar2->NavMoveFlags & 0x400U) != 0) && (((uint)(local_10->Size).x & 0x400) != 0)) {
    pIVar2->NavNextActivateId = local_10->ID;
    pIVar2->NavNextActivateFlags = 5;
    pIVar2->NavMoveFlags = pIVar2->NavMoveFlags | 0x1000;
  }
  if ((pIVar2->NavMoveFlags & 0x800U) != 0) {
    pIVar2->NavNextActivateId = local_10->ID;
    pIVar2->NavNextActivateFlags = 0;
  }
  if ((pIVar2->NavMoveFlags & 0x1000U) == 0) {
    NavRestoreHighlightAfterMove();
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestApplyResult()
{
    ImGuiContext& g = *GImGui;
#if IMGUI_DEBUG_NAV_SCORING
    if (g.NavMoveFlags & ImGuiNavMoveFlags_DebugNoResult) // [DEBUG] Scoring all items in NavWindow at all times
        return;
#endif

    // Select which result to use
    ImGuiNavItemData* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : (g.NavMoveResultOther.ID != 0) ? &g.NavMoveResultOther : NULL;

    // Tabbing forward wrap
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
        if ((g.NavTabbingCounter == 1 || g.NavTabbingDir == 0) && g.NavTabbingResultFirst.ID)
            result = &g.NavTabbingResultFirst;

    // In a situation when there are no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
    if (result == NULL)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
            g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
        if (g.NavId != 0 && (g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
            NavRestoreHighlightAfterMove();
        return;
    }

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisible.ID != 0 && g.NavMoveResultLocalVisible.ID != g.NavId)
            result = &g.NavMoveResultLocalVisible;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_ScrollToEdgeY)
        {
            // FIXME: Should remove this
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = WindowRectRelToAbs(result->Window, result->RectRel);
            ScrollToRectEx(result->Window, rect_abs, g.NavMoveScrollFlags);
        }
    }

    if (g.NavWindow != result->Window)
    {
        IMGUI_DEBUG_LOG_FOCUS("[focus] NavMoveRequest: SetNavWindow(\"%s\")\n", result->Window->Name);
        g.NavWindow = result->Window;
    }
    if (g.ActiveId != result->ID)
        ClearActiveID();
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveKeyMods;
    }

    // Focus
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);

    // Tabbing: Activates Inputable or Focus non-Inputable
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && (result->InFlags & ImGuiItemFlags_Inputable))
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_PreferInput | ImGuiActivateFlags_TryToPreserveState;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
    }

    // Activate
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Activate)
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_None;
    }

    // Enable nav highlight
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
        NavRestoreHighlightAfterMove();
}